

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INIConfig.cpp
# Opt level: O3

bool __thiscall Jupiter::INIConfig::write_internal(INIConfig *this,char *in_filename)

{
  FILE *__stream;
  
  __stream = fopen(in_filename,"wb");
  if (__stream != (FILE *)0x0) {
    write_helper(this,(FILE *)__stream,&this->super_Config,0);
    fclose(__stream);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool Jupiter::INIConfig::write_internal(const char *in_filename)
{
	// Open file
	FILE *file = fopen(in_filename, "wb");

	if (file == nullptr) {
		return false;
	}

	// Iterate through table and sections
	write_helper(file, this, 0);

	// File writing completed; close and return
	fclose(file);
	return true;
}